

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O3

void Abc_NtkDontCareTruthOne(Odc_Man_t *p,Odc_Lit_t Lit)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  void **ppvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  ushort uVar8;
  uint uVar9;
  long lVar10;
  
  if ((Lit & 1) != 0) {
    __assert_fail("!Odc_IsComplement( Lit )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcOdc.c"
                  ,0x395,"void Abc_NtkDontCareTruthOne(Odc_Man_t *, Odc_Lit_t)");
  }
  uVar8 = Lit >> 1;
  uVar9 = (uint)uVar8;
  if ((int)uVar9 <= p->nPis) {
    __assert_fail("!Odc_IsTerm( p, Lit )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcOdc.c"
                  ,0x396,"void Abc_NtkDontCareTruthOne(Odc_Man_t *, Odc_Lit_t)");
  }
  if (p->nObjs <= (int)uVar9) {
    __assert_fail("!(Lit & 1) && (int)(Lit>>1) < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcOdc.c"
                  ,0x79,"Odc_Obj_t *Odc_Lit2Obj(Odc_Man_t *, Odc_Lit_t)");
  }
  uVar3 = p->vTruths->nSize;
  if ((int)uVar9 < (int)uVar3) {
    uVar1 = p->pObjs[uVar8].iFan0;
    if (uVar1 >> 1 < uVar3) {
      uVar2 = p->pObjs[uVar8].iFan1;
      if (uVar2 >> 1 < uVar3) {
        ppvVar4 = p->vTruths->pArray;
        pvVar5 = ppvVar4[uVar8];
        pvVar6 = ppvVar4[(uint)(uVar1 >> 1)];
        pvVar7 = ppvVar4[(uint)(uVar2 >> 1)];
        if ((uVar1 & uVar2 & 1) == 0) {
          if ((uVar1 & 1) == 0 || (uVar2 & 1) != 0) {
            if (((uVar1 & 1) == 0 & (byte)uVar2) == 0) {
              if (0 < p->nWords) {
                lVar10 = 0;
                do {
                  *(uint *)((long)pvVar5 + lVar10 * 4) =
                       *(uint *)((long)pvVar7 + lVar10 * 4) & *(uint *)((long)pvVar6 + lVar10 * 4);
                  lVar10 = lVar10 + 1;
                } while (lVar10 < p->nWords);
              }
            }
            else if (0 < p->nWords) {
              lVar10 = 0;
              do {
                *(uint *)((long)pvVar5 + lVar10 * 4) =
                     ~*(uint *)((long)pvVar7 + lVar10 * 4) & *(uint *)((long)pvVar6 + lVar10 * 4);
                lVar10 = lVar10 + 1;
              } while (lVar10 < p->nWords);
            }
          }
          else if (0 < p->nWords) {
            lVar10 = 0;
            do {
              *(uint *)((long)pvVar5 + lVar10 * 4) =
                   ~*(uint *)((long)pvVar6 + lVar10 * 4) & *(uint *)((long)pvVar7 + lVar10 * 4);
              lVar10 = lVar10 + 1;
            } while (lVar10 < p->nWords);
          }
        }
        else if (0 < p->nWords) {
          lVar10 = 0;
          do {
            *(uint *)((long)pvVar5 + lVar10 * 4) =
                 ~(*(uint *)((long)pvVar7 + lVar10 * 4) | *(uint *)((long)pvVar6 + lVar10 * 4));
            lVar10 = lVar10 + 1;
          } while (lVar10 < p->nWords);
        }
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Abc_NtkDontCareTruthOne( Odc_Man_t * p, Odc_Lit_t Lit )
{
    Odc_Obj_t * pObj;
    unsigned * pInfo, * pInfo1, * pInfo2;
    int k, fComp1, fComp2;
    assert( !Odc_IsComplement( Lit ) );
    assert( !Odc_IsTerm( p, Lit ) );
    // get the truth tables
    pObj   = Odc_Lit2Obj( p, Lit );
    pInfo  = Odc_ObjTruth( p, Lit );
    pInfo1 = Odc_ObjTruth( p, Odc_ObjFanin0(pObj) );
    pInfo2 = Odc_ObjTruth( p, Odc_ObjFanin1(pObj) );
    fComp1 = Odc_ObjFaninC0( pObj );
    fComp2 = Odc_ObjFaninC1( pObj );
    // simulate
    if ( fComp1 && fComp2 )
        for ( k = 0; k < p->nWords; k++ )
            pInfo[k] = ~pInfo1[k] & ~pInfo2[k];
    else if ( fComp1 && !fComp2 )
        for ( k = 0; k < p->nWords; k++ )
            pInfo[k] = ~pInfo1[k] &  pInfo2[k];
    else if ( !fComp1 && fComp2 )
        for ( k = 0; k < p->nWords; k++ )
            pInfo[k] =  pInfo1[k] & ~pInfo2[k];
    else // if ( fComp1 && fComp2 )
        for ( k = 0; k < p->nWords; k++ )
            pInfo[k] =  pInfo1[k] &  pInfo2[k];
}